

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

void __thiscall
fasttext::ProductQuantizer::MStep
          (ProductQuantizer *this,real *x0,real *centroids,uint8_t *codes,int32_t d,int32_t n)

{
  real *__src;
  byte bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  pointer piVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  real *prVar10;
  size_t sVar11;
  ulong uVar12;
  result_type_conflict rVar13;
  undefined1 auVar14 [16];
  undefined4 in_XMM2_Db;
  undefined8 in_XMM2_Qb;
  allocator_type local_99;
  real *local_98;
  int local_8c;
  size_t local_88;
  int32_t local_7c;
  long local_78;
  vector<int,_std::allocator<int>_> nelts;
  undefined1 local_48 [24];
  
  auVar3._12_4_ = 0;
  auVar3._0_12_ = local_48._4_12_;
  local_48._0_16_ = auVar3 << 0x20;
  local_98 = centroids;
  std::vector<int,_std::allocator<int>_>::vector
            (&nelts,(long)this->ksub_,(value_type_conflict1 *)local_48,&local_99);
  local_88 = (long)d * 4;
  local_8c = d;
  memset(local_98,0,(long)this->ksub_ * local_88);
  uVar12 = (ulong)(uint)(~(d >> 0x1f) & d);
  for (uVar7 = 0; uVar7 != (uint)(~(n >> 0x1f) & n); uVar7 = uVar7 + 1) {
    bVar1 = codes[uVar7];
    iVar8 = (uint)bVar1 * local_8c;
    for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      local_98[(long)iVar8 + uVar9] = x0[uVar9] + local_98[(long)iVar8 + uVar9];
    }
    nelts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [bVar1] = nelts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[bVar1] + 1;
    x0 = (real *)((long)x0 + local_88);
  }
  uVar5 = this->ksub_;
  prVar10 = local_98;
  for (uVar7 = 0; uVar7 != (~((int)uVar5 >> 0x1f) & uVar5); uVar7 = uVar7 + 1) {
    iVar8 = nelts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar7];
    if (iVar8 != 0) {
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        prVar10[uVar9] = prVar10[uVar9] / (float)iVar8;
      }
    }
    prVar10 = (real *)((long)prVar10 + local_88);
  }
  local_48._0_16_ = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  sVar11 = local_88;
  prVar10 = local_98;
  local_7c = n;
  for (lVar6 = 0; lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
    if (nelts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar6] == 0) {
      iVar8 = 0;
      local_78 = lVar6;
      while( true ) {
        rVar13 = std::uniform_real_distribution<double>::operator()
                           ((uniform_real_distribution<double> *)local_48,&this->rng);
        piVar4 = nelts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        if (rVar13 * (double)(local_7c - this->ksub_) <
            (double)(nelts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar8] + -1)) break;
        iVar8 = (iVar8 + 1) % this->ksub_;
      }
      __src = local_98 + iVar8 * local_8c;
      memcpy(local_98 + local_78 * d,__src,local_88);
      for (lVar6 = 0; uVar12 * 2 != lVar6; lVar6 = lVar6 + 2) {
        auVar14._0_4_ = (float)(int)(((uint)lVar6 & 2) - 1);
        auVar14._8_8_ = in_XMM2_Qb;
        auVar14._4_4_ = in_XMM2_Db;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)this->eps_),auVar14,
                                 ZEXT416(*(uint *)((long)prVar10 + lVar6 * 2)));
        *(int *)((long)prVar10 + lVar6 * 2) = auVar3._0_4_;
        auVar3 = vfnmadd213ss_fma(ZEXT416((uint)this->eps_),auVar14,
                                  ZEXT416(*(uint *)((long)__src + lVar6 * 2)));
        *(int *)((long)__src + lVar6 * 2) = auVar3._0_4_;
      }
      iVar2 = piVar4[iVar8];
      piVar4[local_78] = iVar2 / 2;
      piVar4[iVar8] = piVar4[iVar8] - iVar2 / 2;
      uVar5 = this->ksub_;
      lVar6 = local_78;
      sVar11 = local_88;
    }
    prVar10 = (real *)((long)prVar10 + sVar11);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&nelts.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void ProductQuantizer::MStep(
    const real* x0,
    real* centroids,
    const uint8_t* codes,
    int32_t d,
    int32_t n) {
  std::vector<int32_t> nelts(ksub_, 0);
  memset(centroids, 0, sizeof(real) * d * ksub_);
  const real* x = x0;
  for (auto i = 0; i < n; i++) {
    auto k = codes[i];
    real* c = centroids + k * d;
    for (auto j = 0; j < d; j++) {
      c[j] += x[j];
    }
    nelts[k]++;
    x += d;
  }

  real* c = centroids;
  for (auto k = 0; k < ksub_; k++) {
    real z = (real)nelts[k];
    if (z != 0) {
      for (auto j = 0; j < d; j++) {
        c[j] /= z;
      }
    }
    c += d;
  }

  std::uniform_real_distribution<> runiform(0, 1);
  for (auto k = 0; k < ksub_; k++) {
    if (nelts[k] == 0) {
      int32_t m = 0;
      while (runiform(rng) * (n - ksub_) >= nelts[m] - 1) {
        m = (m + 1) % ksub_;
      }
      memcpy(centroids + k * d, centroids + m * d, sizeof(real) * d);
      for (auto j = 0; j < d; j++) {
        int32_t sign = (j % 2) * 2 - 1;
        centroids[k * d + j] += sign * eps_;
        centroids[m * d + j] -= sign * eps_;
      }
      nelts[k] = nelts[m] / 2;
      nelts[m] -= nelts[k];
    }
  }
}